

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O3

void __thiscall
cmExportFileGenerator::GenerateImportVersionCode(cmExportFileGenerator *this,ostream *os)

{
  std::__ostream_insert<char,std::char_traits<char>>
            (os,"# Commands may need to know the format version.\n",0x30);
  std::__ostream_insert<char,std::char_traits<char>>(os,"set(CMAKE_IMPORT_FILE_VERSION 1)\n",0x21);
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
  return;
}

Assistant:

void cmExportFileGenerator::GenerateImportVersionCode(std::ostream& os)
{
  // Store an import file format version.  This will let us change the
  // format later while still allowing old import files to work.
  /* clang-format off */
  os << "# Commands may need to know the format version.\n"
     << "set(CMAKE_IMPORT_FILE_VERSION 1)\n"
     << "\n";
  /* clang-format on */
}